

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# input_buffer.cc
# Opt level: O1

void __thiscall dtc::text_input_buffer::skip_spaces(text_input_buffer *this)

{
  element_type *peVar1;
  bool bVar2;
  bool bVar3;
  _Elt_pointer psVar4;
  byte bVar5;
  int iVar6;
  
  while( true ) {
    bVar2 = finished(this);
    if (bVar2) {
      return;
    }
    psVar4 = (this->input_stack).c.
             super__Deque_base<std::shared_ptr<dtc::input_buffer>,_std::allocator<std::shared_ptr<dtc::input_buffer>_>_>
             ._M_impl.super__Deque_impl_data._M_finish._M_cur;
    if (psVar4 == (this->input_stack).c.
                  super__Deque_base<std::shared_ptr<dtc::input_buffer>,_std::allocator<std::shared_ptr<dtc::input_buffer>_>_>
                  ._M_impl.super__Deque_impl_data._M_start._M_cur) {
      bVar5 = 0;
    }
    else {
      if (psVar4 == (this->input_stack).c.
                    super__Deque_base<std::shared_ptr<dtc::input_buffer>,_std::allocator<std::shared_ptr<dtc::input_buffer>_>_>
                    ._M_impl.super__Deque_impl_data._M_finish._M_first) {
        psVar4 = (this->input_stack).c.
                 super__Deque_base<std::shared_ptr<dtc::input_buffer>,_std::allocator<std::shared_ptr<dtc::input_buffer>_>_>
                 ._M_impl.super__Deque_impl_data._M_finish._M_node[-1] + 0x20;
      }
      peVar1 = psVar4[-1].super___shared_ptr<dtc::input_buffer,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      iVar6 = peVar1->cursor;
      bVar5 = 0;
      if ((-1 < (long)iVar6) && (iVar6 < peVar1->size)) {
        bVar5 = peVar1->buffer[iVar6];
      }
    }
    bVar2 = false;
    while ((bVar5 - 9 < 5 || (bVar5 == 0x20))) {
      psVar4 = (this->input_stack).c.
               super__Deque_base<std::shared_ptr<dtc::input_buffer>,_std::allocator<std::shared_ptr<dtc::input_buffer>_>_>
               ._M_impl.super__Deque_impl_data._M_finish._M_cur;
      if (psVar4 != (this->input_stack).c.
                    super__Deque_base<std::shared_ptr<dtc::input_buffer>,_std::allocator<std::shared_ptr<dtc::input_buffer>_>_>
                    ._M_impl.super__Deque_impl_data._M_start._M_cur) {
        this->cursor = this->cursor + 1;
        if (psVar4 == (this->input_stack).c.
                      super__Deque_base<std::shared_ptr<dtc::input_buffer>,_std::allocator<std::shared_ptr<dtc::input_buffer>_>_>
                      ._M_impl.super__Deque_impl_data._M_finish._M_first) {
          psVar4 = (this->input_stack).c.
                   super__Deque_base<std::shared_ptr<dtc::input_buffer>,_std::allocator<std::shared_ptr<dtc::input_buffer>_>_>
                   ._M_impl.super__Deque_impl_data._M_finish._M_node[-1] + 0x20;
        }
        peVar1 = psVar4[-1].super___shared_ptr<dtc::input_buffer,_(__gnu_cxx::_Lock_policy)2>._M_ptr
        ;
        iVar6 = peVar1->cursor + 1;
        peVar1->cursor = iVar6;
        if (peVar1->size <= iVar6) {
          std::
          deque<std::shared_ptr<dtc::input_buffer>,_std::allocator<std::shared_ptr<dtc::input_buffer>_>_>
          ::pop_back(&(this->input_stack).c);
        }
      }
      bVar2 = bVar5 == 10 || bVar5 == 0xd;
      bVar3 = finished(this);
      bVar5 = 0;
      if (!bVar3) {
        psVar4 = (this->input_stack).c.
                 super__Deque_base<std::shared_ptr<dtc::input_buffer>,_std::allocator<std::shared_ptr<dtc::input_buffer>_>_>
                 ._M_impl.super__Deque_impl_data._M_finish._M_cur;
        bVar5 = 0;
        if (psVar4 != (this->input_stack).c.
                      super__Deque_base<std::shared_ptr<dtc::input_buffer>,_std::allocator<std::shared_ptr<dtc::input_buffer>_>_>
                      ._M_impl.super__Deque_impl_data._M_start._M_cur) {
          if (psVar4 == (this->input_stack).c.
                        super__Deque_base<std::shared_ptr<dtc::input_buffer>,_std::allocator<std::shared_ptr<dtc::input_buffer>_>_>
                        ._M_impl.super__Deque_impl_data._M_finish._M_first) {
            psVar4 = (this->input_stack).c.
                     super__Deque_base<std::shared_ptr<dtc::input_buffer>,_std::allocator<std::shared_ptr<dtc::input_buffer>_>_>
                     ._M_impl.super__Deque_impl_data._M_finish._M_node[-1] + 0x20;
          }
          peVar1 = psVar4[-1].super___shared_ptr<dtc::input_buffer,_(__gnu_cxx::_Lock_policy)2>.
                   _M_ptr;
          iVar6 = peVar1->cursor;
          bVar5 = 0;
          if ((-1 < (long)iVar6) && (bVar5 = 0, iVar6 < peVar1->size)) {
            bVar5 = peVar1->buffer[iVar6];
          }
        }
      }
    }
    if ((bVar5 == 0x23) && (!(bool)(~bVar2 & this->cursor != 0))) {
      skip_to(this,'\n');
      skip_spaces(this);
    }
    bVar2 = consume(this,"/include/");
    if (!bVar2) break;
    handle_include(this);
  }
  return;
}

Assistant:

void
text_input_buffer::skip_spaces()
{
	if (finished()) { return; }
	char c = *(*this);
	bool last_nl = false;
	while ((c == ' ') || (c == '\t') || (c == '\n') || (c == '\f')
	       || (c == '\v') || (c == '\r'))
	{
		last_nl = ((c == '\n') || (c == '\r'));
		++(*this);
		if (finished())
		{
			c = '\0';
		}
		else
		{
			c = *(*this);
		}
	}
	// Skip C preprocessor leftovers
	if ((c == '#') && ((cursor == 0) || last_nl))
	{
		skip_to('\n');
		skip_spaces();
	}
	if (consume("/include/"))
	{
		handle_include();
		skip_spaces();
	}
}